

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugRenderViewportThumbnail(ImDrawList *draw_list,ImGuiViewportP *viewport,ImRect *bb)

{
  float font_size;
  ImGuiWindow **ppIVar1;
  undefined8 in_RDX;
  ImRect IVar2;
  bool window_is_focused;
  ImRect title_r;
  ImRect thumb_r;
  ImGuiWindow *thumb_window;
  int i;
  float alpha_mul;
  ImVec2 off;
  ImVec2 scale;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *in_stack_fffffffffffffdf8;
  ImDrawCornerFlags in_stack_fffffffffffffe04;
  undefined8 in_stack_fffffffffffffe08;
  ImGuiWindow *in_stack_fffffffffffffe10;
  ImRect *in_stack_fffffffffffffe18;
  ImDrawList *in_stack_fffffffffffffe20;
  float wrap_width;
  ImVec2 *text_end;
  char *text_begin;
  ImU32 col;
  ImVec2 *pos;
  ImFont *font;
  ImDrawList *this;
  ImFont *cpu_fine_clip_rect;
  ImVec2 *in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe88;
  ImU32 in_stack_fffffffffffffe8c;
  ImVec2 *in_stack_fffffffffffffe90;
  ImVec2 *in_stack_fffffffffffffe98;
  ImDrawList *in_stack_fffffffffffffea0;
  ImVec2 local_110;
  undefined1 local_108 [24];
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImRect local_c8;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImRect local_88;
  ImVec2 local_78;
  ImVec2 local_70;
  undefined1 local_68 [24];
  int local_50;
  int local_4c;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImFontAtlas *local_28;
  ImGuiContext *local_20;
  undefined8 local_18;
  
  local_20 = GImGui;
  local_28 = (ImFontAtlas *)GImGui->CurrentWindow;
  local_18 = in_RDX;
  local_38 = ImRect::GetSize(in_stack_fffffffffffffdf8);
  local_30 = operator/(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x148007);
  local_48 = operator*(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x148039);
  local_40 = operator-(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x148057);
  local_4c = 0x3f800000;
  GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe10 >> 0x20),
              SUB84(in_stack_fffffffffffffe10,0));
  ImDrawList::AddRectFilled
            (in_stack_fffffffffffffe20,&in_stack_fffffffffffffe18->Min,
             (ImVec2 *)in_stack_fffffffffffffe10,(ImU32)((ulong)in_stack_fffffffffffffe08 >> 0x20),
             (float)in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
  for (local_50 = 0; local_50 != (local_20->Windows).Size; local_50 = local_50 + 1) {
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](&local_20->Windows,local_50);
    local_68._16_8_ = *ppIVar1;
    if (((((ImGuiWindow *)local_68._16_8_)->WasActive & 1U) != 0) &&
       ((((ImGuiWindow *)local_68._16_8_)->Flags & 0x1000000U) == 0)) {
      IVar2 = ImGuiWindow::Rect((ImGuiWindow *)0x148173);
      local_68._8_8_ = IVar2.Max;
      local_68._0_8_ = IVar2.Min;
      in_stack_fffffffffffffe98 = (ImVec2 *)(local_68 + 8);
      IVar2 = ImGuiWindow::TitleBarRect(in_stack_fffffffffffffe10);
      local_70 = IVar2.Max;
      local_78 = IVar2.Min;
      local_a0 = operator*(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x1481d1);
      local_98 = operator+(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x1481f7);
      local_90 = ImFloor(&in_stack_fffffffffffffdf8->Min);
      local_b8 = operator*(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x14822b);
      local_b0 = operator+(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x148249);
      local_a8 = ImFloor(&in_stack_fffffffffffffdf8->Min);
      ImRect::ImRect(&local_88,&local_90,&local_a8);
      local_68._0_4_ = local_88.Min.x;
      local_68._4_4_ = local_88.Min.y;
      local_68._8_4_ = local_88.Max.x;
      local_68._12_4_ = local_88.Max.y;
      local_e0 = operator*(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x1482aa);
      local_d8 = operator+(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x1482c8);
      local_d0 = ImFloor(&in_stack_fffffffffffffdf8->Min);
      in_stack_fffffffffffffea0 = (ImDrawList *)local_108;
      ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffea0,local_70.x,local_78.y);
      local_108._8_8_ = operator*(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x148323);
      local_108._16_8_ = operator+(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x148341);
      local_f0 = ImFloor(&in_stack_fffffffffffffdf8->Min);
      ImVec2::ImVec2(&local_110,0.0,5.0);
      local_e8 = operator+(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x148395);
      ImRect::ImRect(&local_c8,&local_d0,&local_e8);
      local_78 = local_c8.Min;
      local_70 = local_c8.Max;
      ImRect::ClipWithFull((ImRect *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      ImRect::ClipWithFull((ImRect *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      in_stack_fffffffffffffe20 = *(ImDrawList **)&local_28->TexUvLines[0x24].z;
      wrap_width = (float)((ulong)local_68 >> 0x20);
      text_end = (ImVec2 *)(local_68 + 8);
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                  SUB84(in_stack_fffffffffffffe10,0));
      ImDrawList::AddRectFilled
                (in_stack_fffffffffffffe20,&in_stack_fffffffffffffe18->Min,
                 (ImVec2 *)in_stack_fffffffffffffe10,
                 (ImU32)((ulong)in_stack_fffffffffffffe08 >> 0x20),(float)in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe04);
      text_begin = *(char **)&local_28->TexUvLines[0x24].z;
      col = (ImU32)((ulong)&local_78 >> 0x20);
      pos = &local_70;
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                  SUB84(in_stack_fffffffffffffe10,0));
      ImDrawList::AddRectFilled
                (in_stack_fffffffffffffe20,&in_stack_fffffffffffffe18->Min,
                 (ImVec2 *)in_stack_fffffffffffffe10,
                 (ImU32)((ulong)in_stack_fffffffffffffe08 >> 0x20),(float)in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe04);
      font_size = local_28->TexUvLines[0x24].w;
      font = (ImFont *)local_68;
      this = (ImDrawList *)(local_68 + 8);
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                  SUB84(in_stack_fffffffffffffe10,0));
      ImDrawList::AddRect(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                          in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                          in_stack_fffffffffffffe88,
                          (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                          SUB84(in_stack_fffffffffffffe80,0));
      cpu_fine_clip_rect = local_20->Font;
      in_stack_fffffffffffffe80 = &local_78;
      in_stack_fffffffffffffe8c =
           GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                       SUB84(in_stack_fffffffffffffe10,0));
      in_stack_fffffffffffffe90 = (ImVec2 *)*(char **)local_68._16_8_;
      FindRenderedTextEnd(*(char **)local_68._16_8_,(char *)0x0);
      in_stack_fffffffffffffdf8 = (ImRect *)0x0;
      ImDrawList::AddText(this,font,font_size,pos,col,text_begin,(char *)text_end,wrap_width,
                          (ImVec4 *)cpu_fine_clip_rect);
    }
  }
  GetColorU32(SUB84(local_18,4),(float)local_18);
  ImDrawList::AddRect(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                      in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
                      (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                      SUB84(in_stack_fffffffffffffe80,0));
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = 1.0f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* thumb_window = g.Windows[i];
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImFloor(off + thumb_r.Min * scale), ImFloor(off +  thumb_r.Max * scale));
        title_r = ImRect(ImFloor(off + title_r.Min * scale), ImFloor(off +  ImVec2(title_r.Max.x, title_r.Min.y) * scale) + ImVec2(0,5)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
}